

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O2

int main(void)

{
  Simulation *pSVar1;
  ostream *poVar2;
  double dVar3;
  allocator local_329;
  double mu;
  string local_320;
  double lambda;
  ExponentialVar at;
  ExponentialVar st;
  Sink sink;
  AvgQueueSizeStat avgSizeStat;
  Source source;
  Queue que;
  
  std::operator<<((ostream *)&std::cout,"          ###### M/M/1 example ######\n\n");
  std::operator<<((ostream *)&std::cout,"Insert lambda : ");
  std::istream::_M_extract<double>((double *)&std::cin);
  std::operator<<((ostream *)&std::cout,"Insert mu : ");
  std::istream::_M_extract<double>((double *)&std::cin);
  if (lambda < mu) {
    MetaSim::ExponentialVar::ExponentialVar(&st,lambda);
    MetaSim::ExponentialVar::ExponentialVar(&at,mu);
    Sink::Sink(&sink,"sink");
    Queue::Queue(&que,&sink.super_Node,(RandomVar *)&st,"M/M/1 queue");
    Source::Source(&source,&que.super_Node,(RandomVar *)&at,"source");
    AvgQueueSizeStat::AvgQueueSizeStat(&avgSizeStat,&que,"avg_queue_size");
    MetaSim::attach_stat<Source::ProduceEvent,AvgQueueSizeStat>(&avgSizeStat,&source._prodEvent);
    MetaSim::BaseStat::setTransitory((Tick)0x7d0);
    pSVar1 = MetaSim::Simulation::getInstance();
    MetaSim::DebugStream::setStream(&pSVar1->dbg,"log.txt");
    pSVar1 = MetaSim::Simulation::getInstance();
    std::__cxx11::string::string((string *)&local_320,"All",&local_329);
    MetaSim::DebugStream::enable(&pSVar1->dbg,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    pSVar1 = MetaSim::Simulation::getInstance();
    MetaSim::Simulation::run(pSVar1,(Tick)0x1e8480,8);
    std::operator<<((ostream *)&std::cout,"The average queue length is ");
    dVar3 = MetaSim::BaseStat::getMean((BaseStat *)&avgSizeStat);
    poVar2 = std::ostream::_M_insert<double>(dVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"with a 95% confidence interval of ");
    dVar3 = MetaSim::BaseStat::getConfInterval((BaseStat *)&avgSizeStat,C95);
    poVar2 = std::ostream::_M_insert<double>(dVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    MetaSim::BaseStat::~BaseStat((BaseStat *)&avgSizeStat);
    Source::~Source(&source);
    Queue::~Queue(&que);
    MetaSim::Entity::~Entity((Entity *)&sink);
    MetaSim::RandomVar::~RandomVar((RandomVar *)&at);
    MetaSim::RandomVar::~RandomVar((RandomVar *)&st);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "lambda must be less than mu (otherwise is unstable!!)");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

int main() 
{
        double lambda, mu;

        cout << "          ###### M/M/1 example ######\n\n";

        cout << "Insert lambda : ";
        cin >> lambda;

        cout << "Insert mu : ";
        cin >> mu;

        if (lambda >= mu) {
                cout << "lambda must be less than mu (otherwise is unstable!!)" 
                     << endl;
                exit(-1);
        }

        ExponentialVar st(lambda);
        ExponentialVar at(mu);

        Sink sink("sink");
        Queue que(&sink, &st, "M/M/1 queue");
        Source source(&que, &at, "source");

        AvgQueueSizeStat avgSizeStat(que, "avg_queue_size");
        //avgSizeStat.attach(&source);
        attach_stat(avgSizeStat, source._prodEvent);

        BaseStat::setTransitory(2000);
  
        SIMUL.dbg.setStream("log.txt");
        SIMUL.dbg.enable("All");

        SIMUL.run(2000000, 8);

        cout << "The average queue length is " 
             << avgSizeStat.getMean() << endl;
        cout << "with a 95% confidence interval of " 
             << avgSizeStat.getConfInterval(BaseStat::C95) << endl;
}